

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

int GetNumColors(uint8_t *data,int width,int height,int stride)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint8_t *p;
  int i;
  uint8_t color [256];
  int colors;
  int j;
  int local_12c;
  char local_128 [268];
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_1c = 0;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_128,0,0x100);
  for (local_18 = 0; local_18 < local_10; local_18 = local_18 + 1) {
    lVar1 = local_8 + local_18 * local_14;
    for (local_12c = 0; local_12c < local_c; local_12c = local_12c + 1) {
      local_128[*(byte *)(lVar1 + local_12c)] = '\x01';
    }
  }
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    if (local_128[local_18] != '\0') {
      local_1c = local_1c + 1;
    }
  }
  return local_1c;
}

Assistant:

static int GetNumColors(const uint8_t* data, int width, int height,
                        int stride) {
  int j;
  int colors = 0;
  uint8_t color[256] = { 0 };

  for (j = 0; j < height; ++j) {
    int i;
    const uint8_t* const p = data + j * stride;
    for (i = 0; i < width; ++i) {
      color[p[i]] = 1;
    }
  }
  for (j = 0; j < 256; ++j) {
    if (color[j] > 0) ++colors;
  }
  return colors;
}